

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::Exception::Detail> * __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::operator=
          (ArrayBuilder<kj::Exception::Detail> *this,ArrayBuilder<kj::Exception::Detail> *other)

{
  RemoveConst<kj::Exception::Detail> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Detail *)0x0;
  other->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  other->endPtr = (Detail *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }